

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_pack4.h
# Opt level: O0

void ncnn::padding_reflect_pack4_sse(Mat *src,Mat *dst,int top,int bottom,int left,int right)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int x_5;
  __m128 _p_4;
  int x_4;
  __m128 _p_3;
  int x_3;
  int y_1;
  __m128 _p_2;
  int x_2;
  __m128 _p_1;
  int x_1;
  __m128 _p;
  int x;
  float *ptr0;
  int y;
  float *outptr;
  float *ptr;
  int local_2cc;
  int local_2ac;
  int local_28c;
  undefined8 *local_288;
  int local_27c;
  int local_25c;
  int local_23c;
  int local_220;
  int local_21c;
  int local_1fc;
  int local_1dc;
  int local_1bc;
  undefined8 *local_1b8;
  int local_1ac;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  __m128 _p_8;
  int x_8;
  __m128 _p_7;
  int x_7;
  __m128 _p_6;
  int x_6;
  float *ptr0_1;
  int y_2;
  __m128 _p_5;
  
  local_1a8 = (undefined8 *)*in_RSI;
  local_1a0 = (undefined8 *)(*in_RDI + (long)(in_EDX * *(int *)((long)in_RDI + 0x2c) * 4) * 4);
  for (local_1ac = 0; local_1ac < in_EDX; local_1ac = local_1ac + 1) {
    local_1b8 = local_1a0;
    for (local_1bc = 0; local_1bc < in_R8D; local_1bc = local_1bc + 1) {
      puVar2 = (undefined8 *)((long)local_1a0 + (long)((in_R8D - local_1bc) * 4) * 4);
      uVar1 = puVar2[1];
      *local_1a8 = *puVar2;
      local_1a8[1] = uVar1;
      local_1a8 = local_1a8 + 2;
    }
    for (local_1dc = 0; local_1dc < *(int *)((long)in_RDI + 0x2c); local_1dc = local_1dc + 1) {
      uVar1 = local_1b8[1];
      *local_1a8 = *local_1b8;
      local_1a8[1] = uVar1;
      local_1b8 = local_1b8 + 2;
      local_1a8 = local_1a8 + 2;
    }
    for (local_1fc = 0; local_1fc < in_R9D; local_1fc = local_1fc + 1) {
      puVar2 = (undefined8 *)((long)local_1b8 + (long)(local_1fc << 2) * -4 + -0x20);
      uVar1 = puVar2[1];
      *local_1a8 = *puVar2;
      local_1a8[1] = uVar1;
      local_1a8 = local_1a8 + 2;
    }
    local_1a0 = (undefined8 *)((long)local_1a0 + (long)(*(int *)((long)in_RDI + 0x2c) << 2) * -4);
  }
  for (local_21c = 0; local_21c < (int)in_RDI[6]; local_21c = local_21c + 1) {
    for (local_220 = 0; local_220 < in_R8D; local_220 = local_220 + 1) {
      puVar2 = (undefined8 *)((long)local_1a0 + (long)((in_R8D - local_220) * 4) * 4);
      uVar1 = puVar2[1];
      *local_1a8 = *puVar2;
      local_1a8[1] = uVar1;
      local_1a8 = local_1a8 + 2;
    }
    for (local_23c = 0; local_23c < *(int *)((long)in_RDI + 0x2c); local_23c = local_23c + 1) {
      uVar1 = local_1a0[1];
      *local_1a8 = *local_1a0;
      local_1a8[1] = uVar1;
      local_1a0 = local_1a0 + 2;
      local_1a8 = local_1a8 + 2;
    }
    for (local_25c = 0; local_25c < in_R9D; local_25c = local_25c + 1) {
      puVar2 = (undefined8 *)((long)local_1a0 + (long)(local_25c << 2) * -4 + -0x20);
      uVar1 = puVar2[1];
      *local_1a8 = *puVar2;
      local_1a8[1] = uVar1;
      local_1a8 = local_1a8 + 2;
    }
  }
  local_1a0 = (undefined8 *)((long)local_1a0 + (long)(*(int *)((long)in_RDI + 0x2c) << 3) * -4);
  for (local_27c = 0; local_27c < in_ECX; local_27c = local_27c + 1) {
    local_288 = local_1a0;
    for (local_28c = 0; local_28c < in_R8D; local_28c = local_28c + 1) {
      puVar2 = (undefined8 *)((long)local_1a0 + (long)((in_R8D - local_28c) * 4) * 4);
      uVar1 = puVar2[1];
      *local_1a8 = *puVar2;
      local_1a8[1] = uVar1;
      local_1a8 = local_1a8 + 2;
    }
    for (local_2ac = 0; local_2ac < *(int *)((long)in_RDI + 0x2c); local_2ac = local_2ac + 1) {
      uVar1 = local_288[1];
      *local_1a8 = *local_288;
      local_1a8[1] = uVar1;
      local_288 = local_288 + 2;
      local_1a8 = local_1a8 + 2;
    }
    for (local_2cc = 0; local_2cc < in_R9D; local_2cc = local_2cc + 1) {
      puVar2 = (undefined8 *)((long)local_288 + (long)(local_2cc << 2) * -4 + -0x20);
      uVar1 = puVar2[1];
      *local_1a8 = *puVar2;
      local_1a8[1] = uVar1;
      local_1a8 = local_1a8 + 2;
    }
    local_1a0 = (undefined8 *)((long)local_1a0 + (long)(*(int *)((long)in_RDI + 0x2c) << 2) * -4);
  }
  return;
}

Assistant:

static void padding_reflect_pack4_sse(const Mat& src, Mat& dst, int top, int bottom, int left, int right)
{
    const float* ptr = src;
    float* outptr = dst;

    // fill top
    ptr += top * src.w * 4;
    for (int y = 0; y < top; y++)
    {
        const float* ptr0 = ptr;
        for (int x = 0; x < left; x++)
        {
            __m128 _p = _mm_load_ps(ptr0 + (left - x) * 4);
            _mm_store_ps(outptr, _p);
            outptr += 4;
        }
        for (int x = 0; x < src.w; x++)
        {
            __m128 _p = _mm_load_ps(ptr0);
            _mm_store_ps(outptr, _p);
            ptr0 += 4;
            outptr += 4;
        }
        for (int x = 0; x < right; x++)
        {
            __m128 _p = _mm_load_ps(ptr0 - 8 - x * 4);
            _mm_store_ps(outptr, _p);
            outptr += 4;
        }
        ptr -= src.w * 4;
    }
    // fill center
    for (int y = 0; y < src.h; y++)
    {
        for (int x = 0; x < left; x++)
        {
            __m128 _p = _mm_load_ps(ptr + (left - x) * 4);
            _mm_store_ps(outptr, _p);
            outptr += 4;
        }
        for (int x = 0; x < src.w; x++)
        {
            __m128 _p = _mm_load_ps(ptr);
            _mm_store_ps(outptr, _p);
            ptr += 4;
            outptr += 4;
        }
        for (int x = 0; x < right; x++)
        {
            __m128 _p = _mm_load_ps(ptr - 8 - x * 4);
            _mm_store_ps(outptr, _p);
            outptr += 4;
        }
    }
    // fill bottom
    ptr -= 2 * src.w * 4;
    for (int y = 0; y < bottom; y++)
    {
        const float* ptr0 = ptr;
        for (int x = 0; x < left; x++)
        {
            __m128 _p = _mm_load_ps(ptr0 + (left - x) * 4);
            _mm_store_ps(outptr, _p);
            outptr += 4;
        }
        for (int x = 0; x < src.w; x++)
        {
            __m128 _p = _mm_load_ps(ptr0);
            _mm_store_ps(outptr, _p);
            ptr0 += 4;
            outptr += 4;
        }
        for (int x = 0; x < right; x++)
        {
            __m128 _p = _mm_load_ps(ptr0 - 8 - x * 4);
            _mm_store_ps(outptr, _p);
            outptr += 4;
        }
        ptr -= src.w * 4;
    }
}